

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCBoolean.cpp
# Opt level: O1

void Assimp::IFC::FilterPolygon
               (vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_> *resultpoly)

{
  double dVar1;
  double dVar2;
  double dVar3;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  __last;
  aiVector3t<double> *paVar4;
  pointer paVar5;
  ulong uVar6;
  __normal_iterator<aiVector3t<double>_*,_std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>_>
  _Var7;
  pointer paVar8;
  long lVar9;
  double dVar10;
  _Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare> __binary_pred;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  
  _Var7._M_current =
       (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
       _M_impl.super__Vector_impl_data._M_start;
  __last._M_current =
       (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = ((long)__last._M_current - (long)_Var7._M_current >> 3) * -0x5555555555555555;
  if (uVar6 < 3) {
    if (__last._M_current == _Var7._M_current) {
      return;
    }
  }
  else {
    if ((int)uVar6 == 0) {
      dVar15 = -20000000000.0;
      dVar11 = -20000000000.0;
      dVar10 = -20000000000.0;
    }
    else {
      dVar12 = 10000000000.0;
      dVar10 = -10000000000.0;
      lVar9 = 0;
      dVar11 = -10000000000.0;
      dVar15 = -10000000000.0;
      dVar13 = 10000000000.0;
      dVar14 = 10000000000.0;
      do {
        dVar1 = *(double *)((long)&(_Var7._M_current)->x + lVar9);
        dVar2 = *(double *)((long)&(_Var7._M_current)->y + lVar9);
        if (dVar1 <= dVar14) {
          dVar14 = dVar1;
        }
        if (dVar2 <= dVar13) {
          dVar13 = dVar2;
        }
        dVar3 = *(double *)((long)&(_Var7._M_current)->z + lVar9);
        if (dVar3 <= dVar12) {
          dVar12 = dVar3;
        }
        if (dVar15 <= dVar1) {
          dVar15 = dVar1;
        }
        if (dVar11 <= dVar2) {
          dVar11 = dVar2;
        }
        if (dVar10 <= dVar3) {
          dVar10 = dVar3;
        }
        lVar9 = lVar9 + 0x18;
      } while ((uVar6 & 0xffffffff) * 0x18 != lVar9);
      dVar15 = dVar15 - dVar14;
      dVar11 = dVar11 - dVar13;
      dVar10 = dVar10 - dVar12;
    }
    __binary_pred._M_comp.epsilon =
         (FuzzyVectorCompare)((dVar10 * dVar10 + dVar15 * dVar15 + dVar11 * dVar11) / 1000000.0);
    _Var7 = std::
            __unique<__gnu_cxx::__normal_iterator<aiVector3t<double>*,std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>>,__gnu_cxx::__ops::_Iter_comp_iter<Assimp::IFC::FuzzyVectorCompare>>
                      (_Var7,__last,__binary_pred);
    paVar4 = (resultpoly->
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if ((_Var7._M_current != paVar4) &&
       (paVar5 = (resultpoly->
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
                 _M_impl.super__Vector_impl_data._M_finish,
       paVar8 = (pointer)((long)_Var7._M_current + ((long)paVar5 - (long)paVar4)), paVar5 != paVar8)
       ) {
      (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>).
      _M_impl.super__Vector_impl_data._M_finish = paVar8;
    }
    paVar5 = (resultpoly->
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_start;
    paVar8 = (resultpoly->
             super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    if (paVar5 == paVar8) {
      return;
    }
    dVar10 = paVar5->x - paVar8[-1].x;
    dVar11 = paVar5->y - paVar8[-1].y;
    dVar15 = paVar5->z - paVar8[-1].z;
    if ((double)__binary_pred._M_comp.epsilon <=
        ABS(dVar15 * dVar15 + dVar10 * dVar10 + dVar11 * dVar11)) {
      return;
    }
    _Var7._M_current = paVar8 + -1;
  }
  (resultpoly->super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>)._M_impl
  .super__Vector_impl_data._M_finish = _Var7._M_current;
  return;
}

Assistant:

void FilterPolygon(std::vector<IfcVector3>& resultpoly)
{
    if( resultpoly.size() < 3 )
    {
        resultpoly.clear();
        return;
    }

    IfcVector3 vmin, vmax;
    ArrayBounds(resultpoly.data(), static_cast<unsigned int>(resultpoly.size()), vmin, vmax);

    // filter our IfcFloat points - those may happen if a point lies
    // directly on the intersection line or directly on the clipping plane
    const IfcFloat epsilon = (vmax - vmin).SquareLength() / 1e6f;
    FuzzyVectorCompare fz(epsilon);
    std::vector<IfcVector3>::iterator e = std::unique(resultpoly.begin(), resultpoly.end(), fz);

    if( e != resultpoly.end() )
        resultpoly.erase(e, resultpoly.end());

    if( !resultpoly.empty() && fz(resultpoly.front(), resultpoly.back()) )
        resultpoly.pop_back();
}